

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O3

string * __thiscall
flatbuffers::lobster::LobsterGenerator::NamespacedName_abi_cxx11_
          (string *__return_storage_ptr__,LobsterGenerator *this,Definition *def)

{
  Namespace *ns;
  string local_40;
  
  ns = def->defined_namespace;
  EscapeKeyword(&local_40,this,&def->name);
  BaseGenerator::WrapInNameSpace(__return_storage_ptr__,&this->super_BaseGenerator,ns,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedName(const Definition &def) {
    return WrapInNameSpace(def.defined_namespace, NormalizedName(def));
  }